

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

float * __thiscall
delay_line<float>::output(delay_line<float> *this,uint32_t frames_needed,size_t *input_frames_used)

{
  size_t new_capacity;
  ulong uVar1;
  
  uVar1 = (ulong)frames_needed;
  new_capacity = (this->super_processor).channels * uVar1;
  if ((this->delay_output_buffer).capacity_ < new_capacity) {
    auto_array<float>::reserve(&this->delay_output_buffer,new_capacity);
    new_capacity = (this->super_processor).channels * uVar1;
  }
  (this->delay_output_buffer).length_ = 0;
  auto_array<float>::push(&this->delay_output_buffer,(this->delay_input_buffer).data_,new_capacity);
  auto_array<float>::pop
            (&this->delay_input_buffer,(float *)0x0,(this->super_processor).channels * uVar1);
  *input_frames_used = uVar1;
  return (this->delay_output_buffer).data_;
}

Assistant:

T * output(uint32_t frames_needed, size_t * input_frames_used)
  {
    if (delay_output_buffer.capacity() < frames_to_samples(frames_needed)) {
      delay_output_buffer.reserve(frames_to_samples(frames_needed));
    }

    delay_output_buffer.clear();
    delay_output_buffer.push(delay_input_buffer.data(),
                             frames_to_samples(frames_needed));
    delay_input_buffer.pop(nullptr, frames_to_samples(frames_needed));
    *input_frames_used = frames_needed;

    return delay_output_buffer.data();
  }